

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

void __thiscall polyscope::Histogram::renderToTexture(Histogram *this)

{
  element_type *peVar1;
  element_type *peVar2;
  double *in_RDI;
  Histogram *in_stack_000000e0;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  undefined8 local_14;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_c;
  
  if (((*(byte *)((long)in_RDI + 0xc3) & 1) != (*(byte *)((long)in_RDI + 0xc1) & 1)) ||
     ((*(byte *)((long)in_RDI + 0xc4) & 1) != (*(byte *)((long)in_RDI + 0xc2) & 1))) {
    fillBuffers(in_stack_000000e0);
  }
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_14,0.0,0.0,0.0);
  peVar1 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x41aa90);
  (peVar1->clearColor).field_2 = local_c;
  (peVar1->clearColor).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_14;
  (peVar1->clearColor).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_14._4_4_;
  peVar1 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x41aab0);
  peVar1->clearAlpha = 0.2;
  peVar1 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x41aac1);
  (*peVar1->_vptr_FrameBuffer[10])(peVar1,0,0,(ulong)*(uint *)(in_RDI + 0x19));
  peVar1 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x41aaea);
  (*peVar1->_vptr_FrameBuffer[3])();
  peVar1 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x41ab00);
  (*peVar1->_vptr_FrameBuffer[4])();
  peVar2 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x41ab1d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"u_cmapRangeMin",&local_39);
  (*peVar2->_vptr_ShaderProgram[6])
            ((*in_RDI - in_RDI[0x16]) / (in_RDI[0x17] - in_RDI[0x16]),peVar2,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x41aba8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"u_cmapRangeMax",&local_71);
  (*peVar2->_vptr_ShaderProgram[6])
            ((in_RDI[1] - in_RDI[0x16]) / (in_RDI[0x17] - in_RDI[0x16]),peVar2,local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x41ac32);
  (*peVar2->_vptr_ShaderProgram[0x1e])();
  return;
}

Assistant:

void Histogram::renderToTexture() {

  // Refill buffer if needed
  if (currBufferWeighted != useWeighted || currBufferSmoothed != useSmoothed) {
    fillBuffers();
  }

  framebuffer->clearColor = {0.0, 0.0, 0.0};
  framebuffer->clearAlpha = 0.2;
  framebuffer->setViewport(0, 0, texDim, texDim);
  framebuffer->bindForRendering();
  framebuffer->clear();

  // = Set uniforms

  // Colormap range (remapped to the 0-1 coords we use)
  program->setUniform("u_cmapRangeMin", (colormapRange.first - dataRange.first) / (dataRange.second - dataRange.first));
  program->setUniform("u_cmapRangeMax",
                      (colormapRange.second - dataRange.first) / (dataRange.second - dataRange.first));

  // Draw
  program->draw();
}